

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nn_msgqueue_init(nn_msgqueue *self,size_t maxmem)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  nn_msgqueue_chunk *chunk;
  
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = in_RSI;
  pvVar1 = nn_alloc_(0x1544e0);
  if (pvVar1 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
            ,0x28);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined8 *)((long)pvVar1 + 0x2f40) = 0;
  *in_RDI = pvVar1;
  *(undefined4 *)(in_RDI + 1) = 0;
  in_RDI[2] = pvVar1;
  *(undefined4 *)(in_RDI + 3) = 0;
  in_RDI[7] = 0;
  return;
}

Assistant:

void nn_msgqueue_init (struct nn_msgqueue *self, size_t maxmem)
{
    struct nn_msgqueue_chunk *chunk;

    self->count = 0;
    self->mem = 0;
    self->maxmem = maxmem;

    chunk = nn_alloc (sizeof (struct nn_msgqueue_chunk), "msgqueue chunk");
    alloc_assert (chunk);
    chunk->next = NULL;

    self->out.chunk = chunk;
    self->out.pos = 0;
    self->in.chunk = chunk;
    self->in.pos = 0;

    self->cache = NULL;
}